

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O0

void lua_close(lua_State *L)

{
  int iVar1;
  lua_State *L_00;
  lua_State *L_01;
  TValue *pTVar2;
  long in_RDI;
  int i;
  global_State *g;
  lua_State *in_stack_00000018;
  global_State *in_stack_00000030;
  int local_14;
  
  L_00 = (lua_State *)(ulong)*(uint *)(in_RDI + 8);
  L_01 = (lua_State *)(ulong)*(uint *)&L_00[4].base;
  lj_memprof_stop(in_stack_00000018);
  lj_sysprof_stop((lua_State *)CONCAT44(g._4_4_,g._0_4_));
  luaJIT_profile_stop(L_01);
  L_00[6].glref.ptr32 = 0;
  lj_func_closeuv(L,(TValue *)CONCAT44(g._4_4_,g._0_4_));
  lj_gc_separateudata((global_State *)L,g._4_4_);
  *(uint *)&L_00[0xb].top = *(uint *)&L_00[0xb].top & 0xfffffffe;
  *(undefined4 *)((long)&L_00[0xc].top + 4) = 0;
  lj_dispatch_update(in_stack_00000030);
  local_14 = 0;
  do {
    do {
      *(byte *)((long)&L_00[4].glref.ptr32 + 1) = *(byte *)((long)&L_00[4].glref.ptr32 + 1) | 0x10;
      L_01->status = '\0';
      pTVar2 = (TValue *)((ulong)(L_01->stack).ptr32 + 8);
      L_01->top = pTVar2;
      L_01->base = pTVar2;
      L_01->cframe = (void *)0x0;
      iVar1 = lj_vm_cpcall(L_01,0,0,cpfinalize);
    } while (iVar1 != 0);
    local_14 = local_14 + 1;
  } while ((local_14 < 10) &&
          (lj_gc_separateudata((global_State *)L,g._4_4_), *(int *)((long)&L_00[1].cframe + 4) != 0)
          );
  close_state(L_00);
  return;
}

Assistant:

LUA_API void lua_close(lua_State *L)
{
  global_State *g = G(L);
  int i;
  L = mainthread(g);  /* Only the main thread can be closed. */
#if LJ_HASMEMPROF
  lj_memprof_stop(L);
#endif
#if LJ_HASSYSPROF
  lj_sysprof_stop(L);
#endif
#if LJ_HASPROFILE
  luaJIT_profile_stop(L);
#endif
  setgcrefnull(g->cur_L);
  lj_func_closeuv(L, tvref(L->stack));
  lj_gc_separateudata(g, 1);  /* Separate udata which have GC metamethods. */
#if LJ_HASJIT
  G2J(g)->flags &= ~JIT_F_ON;
  G2J(g)->state = LJ_TRACE_IDLE;
  lj_dispatch_update(g);
#endif
  for (i = 0;;) {
    hook_enter(g);
    L->status = LUA_OK;
    L->base = L->top = tvref(L->stack) + 1 + LJ_FR2;
    L->cframe = NULL;
    if (lj_vm_cpcall(L, NULL, NULL, cpfinalize) == LUA_OK) {
      if (++i >= 10) break;
      lj_gc_separateudata(g, 1);  /* Separate udata again. */
      if (gcref(g->gc.mmudata) == NULL)  /* Until nothing is left to do. */
	break;
    }
  }
  close_state(L);
}